

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O2

dispatcher_ptr __thiscall
anon_unknown.dwarf_6bd67d::make_dispatcher
          (anon_unknown_dwarf_6bd67d *this,fragment *f,section_kind kind,
          not_null<std::aligned_storage<16UL,_8UL>::type_*> buffer)

{
  debug_line_section *pdVar1;
  undefined **ppuVar2;
  error_code eVar3;
  error_code erc;
  
  if ((kind < 0x20) && ((1 << (kind & (debug_string|debug_loc)) & (f->arr_).sa_.bitmap_) != 0)) {
    switch(kind) {
    case text:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)0,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case data:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)1,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case bss:
      ppuVar2 = &PTR__bss_section_dispatcher_00230be8;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)2,pstore::repo::fragment_const&,pstore::repo::bss_section_const>
                         (f);
      break;
    case rel_ro:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)3,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_1_byte_c_string:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)4,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_2_byte_c_string:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)5,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_4_byte_c_string:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)6,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_const_4:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)7,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_const_8:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)8,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_const_16:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)9,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case mergeable_const_32:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)10,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case read_only:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)11,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case thread_data:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)12,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case thread_bss:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)13,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case debug_line:
      ppuVar2 = &PTR__debug_line_dispatcher_00230ca0;
      pdVar1 = pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)14,pstore::repo::fragment_const&,pstore::repo::debug_line_section_const>
                         (f);
      break;
    case debug_loc:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)15,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case debug_string:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)16,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case debug_ranges:
      ppuVar2 = &PTR__section_dispatcher_00230e10;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)17,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                         (f);
      break;
    case linked_definitions:
      ppuVar2 = &PTR__linked_definitions_dispatcher_00230d58;
      pdVar1 = (debug_line_section *)
               pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                         (f);
      break;
    default:
      eVar3 = pstore::repo::make_error_code(bad_fragment_type);
      erc._M_cat = eVar3._M_cat;
      erc._0_8_ = erc._M_cat;
      pstore::raise_error_code<std::error_code>((pstore *)(ulong)(uint)eVar3._M_value,erc);
    }
    *(undefined ***)buffer.ptr_ = ppuVar2;
    *(debug_line_section **)((long)buffer.ptr_ + 8) = pdVar1;
    *(type **)this = buffer.ptr_;
    return (__uniq_ptr_data<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter,_true,_true>
            )(__uniq_ptr_data<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter,_true,_true>
              )this;
  }
  pstore::assert_failed
            ("f.has_section (kind)",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
             ,0x45);
}

Assistant:

dispatcher_ptr make_dispatcher (fragment const & f, section_kind const kind,
                                    pstore::gsl::not_null<dispatcher_buffer *> const buffer) {
        PSTORE_ASSERT (f.has_section (kind));

#define X(k)                                                                                       \
    case section_kind::k: return make_dispatcher_for_kind<section_kind::k> (f, buffer);
        switch (kind) {
            PSTORE_MCREPO_SECTION_KINDS
        case section_kind::last: break;
        }
#undef X
        pstore::raise_error_code (make_error_code (pstore::repo::error_code::bad_fragment_type));
    }